

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O3

ssize_t __thiscall
httplib::detail::SocketStream::read(SocketStream *this,int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  int *piVar2;
  undefined4 in_register_00000034;
  ssize_t sVar3;
  
  iVar1 = (*(this->super_Stream)._vptr_Stream[2])();
  sVar3 = -1;
  if ((char)iVar1 != '\0') {
    do {
      sVar3 = recv(this->sock_,(void *)CONCAT44(in_register_00000034,__fd),(size_t)__buf,0);
      if (-1 < sVar3) {
        return sVar3;
      }
      piVar2 = __errno_location();
    } while (*piVar2 == 4);
  }
  return sVar3;
}

Assistant:

inline ssize_t SocketStream::read(char *ptr, size_t size) {
			if (!is_readable()) { return -1; }

#ifdef _WIN32
			if (size > static_cast<size_t>((std::numeric_limits<int>::max)())) {
    return -1;
  }
  return recv(sock_, ptr, static_cast<int>(size), CPPHTTPLIB_RECV_FLAGS);
#else
			return handle_EINTR(
					[&]() { return recv(sock_, ptr, size, CPPHTTPLIB_RECV_FLAGS); });
#endif
		}